

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laplace_pyramid.h
# Opt level: O3

void gimage::collapseLaplacianPyramid<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,
               vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
               *p)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long i;
  long lVar10;
  pointer a;
  long lVar11;
  long lVar12;
  float *pfVar13;
  float fVar14;
  
  a = (p->
      super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(p->
                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)a;
  if (lVar5 == 0) {
    return;
  }
  uVar7 = (lVar5 >> 3) * 0x6db6db6db6db6db7;
  iVar6 = (int)uVar7;
  if (1 < iVar6 && 1 < uVar7) {
    uVar7 = (ulong)(iVar6 - 2);
    do {
      if (0 < a[uVar7].depth) {
        lVar2 = a[uVar7].width;
        lVar3 = a[uVar7].height;
        lVar5 = lVar3 + -2;
        lVar11 = 0;
        if (0 < lVar5) {
          lVar11 = lVar5;
        }
        lVar9 = 0;
        do {
          if (0 < lVar3) {
            pfVar13 = *a[uVar7].img[lVar9];
            lVar8 = 0;
            do {
              iVar6 = (int)lVar9;
              if (0 < lVar2) {
                lVar12 = 0;
                lVar10 = 0;
                do {
                  fVar14 = expandGaussPixel<float>
                                     ((p->
                                      super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar7 + 1,lVar10,
                                      lVar8,iVar6);
                  pfVar13[lVar10] = fVar14 + pfVar13[lVar10];
                  lVar10 = lVar10 + 1;
                  lVar12 = lVar12 + -4;
                } while (lVar2 != lVar10);
                pfVar13 = (float *)((long)pfVar13 - lVar12);
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != (ulong)(lVar3 != 1) + 1);
            if (4 < lVar3) {
              lVar8 = 2;
              do {
                if (0 < lVar2) {
                  fVar14 = expandGaussPixel<float>
                                     ((p->
                                      super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar7 + 1,0,lVar8
                                      ,iVar6);
                  *pfVar13 = fVar14 + *pfVar13;
                  if (lVar2 == 1) {
LAB_0012787f:
                    pfVar13 = pfVar13 + 1;
                  }
                  else {
                    fVar14 = expandGaussPixel<float>
                                       ((p->
                                        super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar7 + 1,1,
                                        lVar8,iVar6);
                    pfVar13[1] = fVar14 + pfVar13[1];
                    if (lVar2 < 5) {
                      pfVar13 = pfVar13 + 2;
                    }
                    else {
                      lVar10 = 2;
                      lVar12 = -8;
                      do {
                        fVar14 = expandGaussPixelInner<float>
                                           ((p->
                                            super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar7 + 1,
                                            lVar10,lVar8,iVar6);
                        pfVar13[lVar10] = fVar14 + pfVar13[lVar10];
                        lVar1 = (4 - lVar2) + lVar10;
                        lVar10 = lVar10 + 1;
                        lVar12 = lVar12 + -4;
                      } while (lVar1 != 1);
                      pfVar13 = (float *)((long)pfVar13 - lVar12);
                    }
                    if (2 < lVar2) {
                      fVar14 = expandGaussPixel<float>
                                         ((p->
                                          super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar7 + 1,
                                          lVar2 + -2,lVar8,iVar6);
                      *pfVar13 = fVar14 + *pfVar13;
                      if (lVar2 == 3) goto LAB_0012787f;
                      fVar14 = expandGaussPixel<float>
                                         ((p->
                                          super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar7 + 1,
                                          lVar2 + -1,lVar8,iVar6);
                      pfVar13[1] = fVar14 + pfVar13[1];
                      pfVar13 = pfVar13 + 2;
                    }
                  }
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 != lVar5);
            }
            lVar8 = lVar11;
            if (0 < lVar3) {
              do {
                if (0 < lVar2) {
                  lVar12 = 0;
                  lVar10 = 0;
                  do {
                    fVar14 = expandGaussPixel<float>
                                       ((p->
                                        super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar7 + 1,
                                        lVar10,lVar8,iVar6);
                    pfVar13[lVar10] = fVar14 + pfVar13[lVar10];
                    lVar10 = lVar10 + 1;
                    lVar12 = lVar12 + -4;
                  } while (lVar2 != lVar10);
                  pfVar13 = (float *)((long)pfVar13 - lVar12);
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 < lVar3);
            }
          }
          lVar9 = lVar9 + 1;
          a = (p->
              super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
        } while (lVar9 < a[uVar7].depth);
      }
      bVar4 = 0 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar4);
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setImageLimited<float>(image,a);
  return;
}

Assistant:

void collapseLaplacianPyramid(Image<T> &image, std::vector<ImageFloat> &p)
{
  if (p.size() < 1) return; // there is no pyramid

  if (p.size() >= 2) // there must be at least two levels for collapsing
  {
    // collapse from highest to lowest level

    for (int l=static_cast<int>(p.size())-2; l>=0; l--)
    {
      // add expanded image of lower level

      const long w=p[l].getWidth();
      const long h=p[l].getHeight();

      // for all color channels

      for (int d=0; d<p[l].getDepth(); d++)
      {
        float *px=p[l].getPtr(0, 0, d);
        for (long k=0; k<2 && k<h; k++)
        {
          for (long i=0; i<w; i++)
          {
            *px++ +=expandGaussPixel(p[l+1], i, k, d);
          }
        }

        for (long k=2; k<h-2; k++)
        {
          if (w > 0) *px++ +=expandGaussPixel(p[l+1], 0, k, d);
          if (w > 1) *px++ +=expandGaussPixel(p[l+1], 1, k, d);

          for (long i=2; i<w-2; i++)
          {
            *px++ +=expandGaussPixelInner(p[l+1], i, k, d);
          }

          if (w > 2) *px++ +=expandGaussPixel(p[l+1], w-2, k, d);
          if (w > 3) *px++ +=expandGaussPixel(p[l+1], w-1, k, d);
        }

        for (long k=std::max(0l, h-2); k<h; k++)
        {
          for (long i=0; i<w; i++)
          {
            *px++ +=expandGaussPixel(p[l+1], i, k, d);
          }
        }
      }
    }
  }

  // image at level 0 is result

  image.setImageLimited(p[0]);
}